

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void libdef_module(BuildCtx *ctx,char *p,int arg)

{
  char *in_RSI;
  long in_RDI;
  BuildCtx *in_stack_00000040;
  
  if (*(int *)(in_RDI + 8) == 7) {
    libdef_endmodule(in_stack_00000040);
    obuf[0] = (uint8_t)ffid;
    obuf[1] = (uint8_t)ffasmfunc;
    optr = obuf + 3;
    obuf[2] = '\0';
    modstate = 1;
    fprintf(*(FILE **)(in_RDI + 0x10),"#ifdef %sMODULE_%s\n","LJLIB_",in_RSI);
    fprintf(*(FILE **)(in_RDI + 0x10),"#undef %sMODULE_%s\n","LJLIB_",in_RSI);
    fprintf(*(FILE **)(in_RDI + 0x10),"static const lua_CFunction %s%s[] = {\n","lj_lib_cf_",in_RSI)
    ;
  }
  modnamelen = strlen(in_RSI);
  if (0x4f < modnamelen) {
    fprintf(_stderr,"Error: module name too long: \'%s\'\n",in_RSI);
    exit(1);
  }
  strcpy(modname,in_RSI);
  return;
}

Assistant:

static void libdef_module(BuildCtx *ctx, char *p, int arg)
{
  UNUSED(arg);
  if (ctx->mode == BUILD_libdef) {
    libdef_endmodule(ctx);
    optr = obuf;
    *optr++ = (uint8_t)ffid;
    *optr++ = (uint8_t)ffasmfunc;
    *optr++ = 0;  /* Hash table size. */
    modstate = 1;
    fprintf(ctx->fp, "#ifdef %sMODULE_%s\n", LIBDEF_PREFIX, p);
    fprintf(ctx->fp, "#undef %sMODULE_%s\n", LIBDEF_PREFIX, p);
    fprintf(ctx->fp, "static const lua_CFunction %s%s[] = {\n",
	    LABEL_PREFIX_LIBCF, p);
  }
  modnamelen = strlen(p);
  if (modnamelen > sizeof(modname)-1) {
    fprintf(stderr, "Error: module name too long: '%s'\n", p);
    exit(1);
  }
  strcpy(modname, p);
}